

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_shape.cxx
# Opt level: O2

void __thiscall Fl_Window::shape_alpha_(Fl_Window *this,Fl_Image *img,int offset)

{
  int iVar1;
  int W;
  uint H;
  shape_data_type *psVar2;
  int iVar3;
  uchar *bits;
  Fl_Bitmap *this_00;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  byte bVar12;
  int iVar13;
  byte bVar7;
  
  iVar1 = img->d_;
  W = img->w_;
  H = img->h_;
  iVar3 = (W + 7) / 8;
  bits = (uchar *)operator_new__((long)(int)(iVar3 * H));
  pbVar4 = (byte *)(*img->data_ + offset);
  uVar5 = 0;
  iVar9 = 0;
  if (0 < W) {
    iVar9 = W;
  }
  uVar10 = 0;
  if (0 < (int)H) {
    uVar10 = (ulong)H;
  }
  for (; uVar5 != uVar10; uVar5 = uVar5 + 1) {
    pbVar11 = bits + uVar5 * (long)iVar3;
    bVar6 = 0;
    bVar12 = 1;
    for (iVar13 = 0; iVar9 != iVar13; iVar13 = iVar13 + 1) {
      uVar8 = (uint)*pbVar4;
      if (iVar1 == 3) {
        uVar8 = (uint)pbVar4[2] + (uint)pbVar4[1] + (uint)*pbVar4;
      }
      bVar7 = (byte)uVar8;
      if (uVar8 != 0) {
        bVar7 = bVar12;
      }
      bVar6 = bVar7 | bVar6;
      bVar12 = bVar12 * '\x02';
      if (W + -1 == iVar13 || bVar12 == 0) {
        *pbVar11 = bVar6;
        pbVar11 = pbVar11 + 1;
        bVar12 = 1;
        bVar6 = 0;
      }
      pbVar4 = pbVar4 + iVar1;
    }
  }
  this_00 = (Fl_Bitmap *)operator_new(0x38);
  Fl_Bitmap::Fl_Bitmap(this_00,bits,W,H);
  this_00->alloc_array = 1;
  psVar2 = shape_data_;
  shape_data_->shape_ = (Fl_Image *)this_00;
  psVar2->todelete_ = this_00;
  return;
}

Assistant:

void Fl_Window::shape_alpha_(Fl_Image* img, int offset) {
  int i, j, d = img->d(), w = img->w(), h = img->h(), bytesperrow = (w+7)/8;
  unsigned u;
  uchar byte, onebit;
  // build an Fl_Bitmap covering the non-fully transparent/black part of the image
  const uchar* bits = new uchar[h*bytesperrow]; // to store the bitmap
  const uchar* alpha = (const uchar*)*img->data() + offset; // points to alpha value of rgba pixels
  for (i = 0; i < h; i++) {
    uchar *p = (uchar*)bits + i * bytesperrow;
    byte = 0;
    onebit = 1;
    for (j = 0; j < w; j++) {
      if (d == 3) {
        u = *alpha;
        u += *(alpha+1);
        u += *(alpha+2);
      }
      else u = *alpha;
      if (u > 0) { // if the pixel is not fully transparent/black
        byte |= onebit; // turn on the corresponding bit of the bitmap
      }
      onebit = onebit << 1; // move the single set bit one position to the left
      if (onebit == 0 || j == w-1) {
        onebit = 1;
        *p++ = byte; // store in bitmap one pack of bits
        byte = 0;
      }
      alpha += d; // point to alpha value of next pixel
    }
  }
  Fl_Bitmap* bitmap = new Fl_Bitmap(bits, w, h);
  bitmap->alloc_array = 1;
  shape_bitmap_(bitmap);
  shape_data_->todelete_ = bitmap;
}